

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cc
# Opt level: O1

state_status_t __thiscall
tchecker::zg::path::concrete::clockval_dbm_t::prev
          (clockval_dbm_t *this,transition_t *t,bool src_delay_allowed,bool tgt_delay_allowed,
          db_t *bounding_dbm)

{
  bool bVar1;
  state_status_t sVar2;
  status_t sVar3;
  integer_t iVar4;
  clock_constraint_container_t scaled_up_guard;
  clock_constraint_container_t scaled_up_tgt_invariant;
  clock_constraint_container_t scaled_up_src_invariant;
  clock_reset_container_t scaled_up_reset;
  
  if (bounding_dbm == (db_t *)0x0) {
    __assert_fail("bounding_dbm != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/zg/path.cc"
                  ,0x247,
                  "tchecker::state_status_t tchecker::zg::path::concrete::clockval_dbm_t::prev(const tchecker::zg::transition_t &, bool, bool, const tchecker::dbm::db_t *)"
                 );
  }
  bVar1 = tchecker::dbm::is_consistent(bounding_dbm,this->_dim);
  if (bVar1) {
    bVar1 = tchecker::dbm::is_tight(bounding_dbm,this->_dim);
    if (bVar1) {
      scale_up(&scaled_up_src_invariant,this,&(t->super_transition_t)._src_invariant);
      scale_up(&scaled_up_tgt_invariant,this,&(t->super_transition_t)._tgt_invariant);
      scale_up(&scaled_up_guard,this,&(t->super_transition_t)._guard);
      scale_up(&scaled_up_reset,this,&(t->super_transition_t)._reset);
      sVar2 = standard_semantics_t::prev
                        (&this->_semantics,this->_dbm,this->_dim,src_delay_allowed,
                         &scaled_up_src_invariant,&scaled_up_guard,&scaled_up_reset,
                         tgt_delay_allowed,&scaled_up_tgt_invariant);
      if (sVar2 == 1) {
        sVar3 = restrict_to_scaled_up_bounding_dbm(this,bounding_dbm);
        if (sVar3 == NON_EMPTY) {
          simplify(this);
          iVar4 = tchecker::dbm::constrain_to_single_valuation(this->_dbm,this->_dim);
          this->_denominator = iVar4 * this->_denominator;
          sVar2 = 1;
          compute_clock_valuation_from_dbm(this);
        }
        else {
          sVar2 = 0x4000;
          invalidate(this);
        }
      }
      else {
        invalidate(this);
      }
      if (scaled_up_reset.
          super__Vector_base<tchecker::clock_reset_t,_std::allocator<tchecker::clock_reset_t>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(scaled_up_reset.
                        super__Vector_base<tchecker::clock_reset_t,_std::allocator<tchecker::clock_reset_t>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)scaled_up_reset.
                              super__Vector_base<tchecker::clock_reset_t,_std::allocator<tchecker::clock_reset_t>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)scaled_up_reset.
                              super__Vector_base<tchecker::clock_reset_t,_std::allocator<tchecker::clock_reset_t>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (scaled_up_guard.
          super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(scaled_up_guard.
                        super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)scaled_up_guard.
                              super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)scaled_up_guard.
                              super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (scaled_up_tgt_invariant.
          super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(scaled_up_tgt_invariant.
                        super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)scaled_up_tgt_invariant.
                              super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)scaled_up_tgt_invariant.
                              super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (scaled_up_src_invariant.
          super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(scaled_up_src_invariant.
                        super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)scaled_up_src_invariant.
                              super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)scaled_up_src_invariant.
                              super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return sVar2;
    }
    __assert_fail("tchecker::dbm::is_tight(bounding_dbm, _dim)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/zg/path.cc"
                  ,0x249,
                  "tchecker::state_status_t tchecker::zg::path::concrete::clockval_dbm_t::prev(const tchecker::zg::transition_t &, bool, bool, const tchecker::dbm::db_t *)"
                 );
  }
  __assert_fail("tchecker::dbm::is_consistent(bounding_dbm, _dim)",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/zg/path.cc"
                ,0x248,
                "tchecker::state_status_t tchecker::zg::path::concrete::clockval_dbm_t::prev(const tchecker::zg::transition_t &, bool, bool, const tchecker::dbm::db_t *)"
               );
}

Assistant:

tchecker::state_status_t prev(tchecker::zg::transition_t const & t, bool src_delay_allowed, bool tgt_delay_allowed,
                                tchecker::dbm::db_t const * bounding_dbm)
  {
    assert(bounding_dbm != nullptr);
    assert(tchecker::dbm::is_consistent(bounding_dbm, _dim));
    assert(tchecker::dbm::is_tight(bounding_dbm, _dim));

    // scale up invariants, guard and reset to _denominator
    tchecker::clock_constraint_container_t scaled_up_src_invariant = scale_up(t.src_invariant_container());
    tchecker::clock_constraint_container_t scaled_up_tgt_invariant = scale_up(t.tgt_invariant_container());
    tchecker::clock_constraint_container_t scaled_up_guard = scale_up(t.guard_container());
    tchecker::clock_reset_container_t scaled_up_reset = scale_up(t.reset_container());

    // compute DBM of previous clock valiations according to t and delays
    tchecker::state_status_t prev_status =
        _semantics.prev(_dbm, _dim, src_delay_allowed, scaled_up_src_invariant, scaled_up_guard, scaled_up_reset,
                        tgt_delay_allowed, scaled_up_tgt_invariant);

    if (prev_status != tchecker::STATE_OK) {
      invalidate();
      return prev_status;
    }

    // restrict to scaled-up bounding_dbm
    enum tchecker::dbm::status_t bounding_status = restrict_to_scaled_up_bounding_dbm(bounding_dbm);

    if (bounding_status != tchecker::dbm::NON_EMPTY) {
      invalidate();
      return tchecker::STATE_BAD;
    }

    // restrict to single valuation
    simplify();
    _denominator *= tchecker::dbm::constrain_to_single_valuation(_dbm, _dim);
    compute_clock_valuation_from_dbm();

    return tchecker::STATE_OK;
  }